

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert.cpp
# Opt level: O0

void __thiscall
libtorrent::torrent_delete_failed_alert::torrent_delete_failed_alert
          (torrent_delete_failed_alert *this,stack_allocator *alloc,torrent_handle *h,error_code *e,
          sha1_hash *ih)

{
  undefined8 uVar1;
  error_category *peVar2;
  string local_50;
  sha1_hash *local_30;
  sha1_hash *ih_local;
  error_code *e_local;
  torrent_handle *h_local;
  stack_allocator *alloc_local;
  torrent_delete_failed_alert *this_local;
  
  local_30 = ih;
  ih_local = (sha1_hash *)e;
  e_local = (error_code *)h;
  h_local = (torrent_handle *)alloc;
  alloc_local = (stack_allocator *)this;
  torrent_alert::torrent_alert(&this->super_torrent_alert,alloc,h);
  (this->super_torrent_alert).super_alert._vptr_alert =
       (_func_int **)&PTR__torrent_delete_failed_alert_00990df0;
  uVar1 = *(undefined8 *)(ih_local->m_number)._M_elems;
  peVar2 = *(error_category **)((ih_local->m_number)._M_elems + 2);
  (this->error).val_ = (int)uVar1;
  (this->error).failed_ = (bool)(char)((ulong)uVar1 >> 0x20);
  *(int3 *)&(this->error).field_0x5 = (int3)((ulong)uVar1 >> 0x28);
  (this->error).cat_ = peVar2;
  (this->info_hash).m_number._M_elems[4] = (local_30->m_number)._M_elems[4];
  uVar1 = *(undefined8 *)((local_30->m_number)._M_elems + 2);
  *(undefined8 *)(this->info_hash).m_number._M_elems = *(undefined8 *)(local_30->m_number)._M_elems;
  *(undefined8 *)((this->info_hash).m_number._M_elems + 2) = uVar1;
  boost::system::error_code::message_abi_cxx11_(&local_50,&this->error);
  convert_from_native(&this->msg,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  return;
}

Assistant:

torrent_delete_failed_alert::torrent_delete_failed_alert(aux::stack_allocator& alloc
		, torrent_handle const& h, error_code const& e, sha1_hash const& ih)
		: torrent_alert(alloc, h)
		, error(e)
		, info_hash(ih)
#if TORRENT_ABI_VERSION == 1
		, msg(convert_from_native(error.message()))
#endif
	{
	}